

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O3

void __thiscall Assimp::OptimizeMeshesProcess::~OptimizeMeshesProcess(OptimizeMeshesProcess *this)

{
  ~OptimizeMeshesProcess(this);
  operator_delete(this);
  return;
}

Assistant:

OptimizeMeshesProcess::~OptimizeMeshesProcess() {
    // empty
}